

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O2

_Bool ecdsa_verify_msg_as_qelem
                (uint64_t *m_q,uint8_t *public_key,uint8_t *signature_r,uint8_t *signature_s)

{
  ulong uVar1;
  _Bool _Var2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  uint32_t i;
  uint64_t *puVar7;
  uint64_t *puVar8;
  uint64_t *t11;
  uint64_t *t11_1;
  uint64_t *t11_2;
  byte bVar9;
  uint64_t tmp [28];
  uint64_t local_dd8 [8];
  uint64_t local_d98 [4];
  uint64_t sinv [4];
  uint64_t x [4];
  uint64_t local_cf8 [12];
  uint64_t local_c98 [12];
  uint64_t local_c38 [12];
  uint64_t local_bd8 [12];
  uint64_t local_b78 [12];
  uint64_t local_b18 [12];
  uint64_t local_ab8 [12];
  uint64_t local_a58 [12];
  uint64_t local_9f8 [12];
  uint64_t local_998 [12];
  uint64_t local_938 [12];
  uint64_t local_8d8 [12];
  uint64_t local_878 [12];
  uint64_t local_818 [12];
  uint64_t local_7b8 [12];
  uint64_t local_758 [12];
  uint64_t local_6f8 [12];
  uint64_t local_698 [12];
  uint64_t local_638 [12];
  uint64_t local_5d8 [12];
  uint64_t local_578 [12];
  uint64_t local_518 [12];
  uint64_t local_4b8 [12];
  uint64_t local_458 [12];
  uint64_t local_3f8 [12];
  uint64_t local_398 [12];
  uint64_t local_338 [12];
  uint64_t local_2d8 [12];
  uint64_t local_278 [12];
  uint64_t local_218 [12];
  uint64_t local_1b8 [12];
  uint64_t local_158 [12];
  uint64_t local_f8 [12];
  uint64_t tmp_1 [12];
  
  bVar9 = 0;
  memset(tmp,0,0xe0);
  _Var2 = load_point_vartime(tmp,public_key);
  uVar1 = *(ulong *)(signature_r + 0x18);
  tmp[0xc] = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = *(ulong *)(signature_r + 0x10);
  tmp[0xd] = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = *(ulong *)(signature_r + 8);
  tmp[0xe] = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = *(ulong *)signature_r;
  tmp[0xf] = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = *(ulong *)(signature_s + 0x18);
  tmp[0x10] = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = *(ulong *)(signature_s + 0x10);
  tmp[0x11] = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = *(ulong *)(signature_s + 8);
  tmp[0x12] = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = *(ulong *)signature_s;
  tmp[0x13] = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  if (_Var2) {
    uVar3 = bn_is_lt_order_and_gt_zero_mask4(tmp + 0x10);
    uVar4 = bn_is_lt_order_and_gt_zero_mask4(tmp + 0xc);
    if ((uVar4 & uVar3) == 0xffffffffffffffff) {
      sinv[2] = 0;
      sinv[3] = 0;
      sinv[0] = 0;
      sinv[1] = 0;
      qinv(sinv,tmp + 0x10);
      qmul_mont(sinv,m_q,tmp + 0x14);
      qmul_mont(sinv,tmp + 0xc,tmp + 0x18);
      memset(local_c98,0,0xb40);
      tmp_1[10] = 0;
      tmp_1[0xb] = 0;
      tmp_1[8] = 0;
      tmp_1[9] = 0;
      tmp_1[6] = 0;
      tmp_1[7] = 0;
      tmp_1[4] = 0;
      tmp_1[5] = 0;
      x[0] = 0;
      x[1] = 0;
      x[2] = 0;
      x[3] = 0;
      tmp_1[2] = 0;
      tmp_1[3] = 0;
      tmp_1[0] = 0;
      tmp_1[1] = 0;
      lVar6 = 0xc;
      puVar7 = tmp;
      puVar8 = local_cf8;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_cf8);
      puVar7 = tmp_1;
      puVar8 = local_c98;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_c98);
      puVar7 = tmp_1;
      puVar8 = local_c38;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_c98);
      puVar7 = tmp_1;
      puVar8 = local_bd8;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_bd8);
      puVar7 = tmp_1;
      puVar8 = local_b78;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_c38);
      puVar7 = tmp_1;
      puVar8 = local_b18;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_b18);
      puVar7 = tmp_1;
      puVar8 = local_ab8;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_bd8);
      puVar7 = tmp_1;
      puVar8 = local_a58;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_a58);
      puVar7 = tmp_1;
      puVar8 = local_9f8;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_b78);
      puVar7 = tmp_1;
      puVar8 = local_998;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_998);
      puVar7 = tmp_1;
      puVar8 = local_938;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_b18);
      puVar7 = tmp_1;
      puVar8 = local_8d8;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_8d8);
      puVar7 = tmp_1;
      puVar8 = local_878;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_ab8);
      puVar7 = tmp_1;
      puVar8 = local_818;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_818);
      puVar7 = tmp_1;
      puVar8 = local_7b8;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_a58);
      puVar7 = tmp_1;
      puVar8 = local_758;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_758);
      puVar7 = tmp_1;
      puVar8 = local_6f8;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_9f8);
      puVar7 = tmp_1;
      puVar8 = local_698;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_698);
      puVar7 = tmp_1;
      puVar8 = local_638;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_998);
      puVar7 = tmp_1;
      puVar8 = local_5d8;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_5d8);
      puVar7 = tmp_1;
      puVar8 = local_578;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_938);
      puVar7 = tmp_1;
      puVar8 = local_518;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_518);
      puVar7 = tmp_1;
      puVar8 = local_4b8;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_8d8);
      puVar7 = tmp_1;
      puVar8 = local_458;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_458);
      puVar7 = tmp_1;
      puVar8 = local_3f8;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_878);
      puVar7 = tmp_1;
      puVar8 = local_398;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_398);
      puVar7 = tmp_1;
      puVar8 = local_338;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_818);
      puVar7 = tmp_1;
      puVar8 = local_2d8;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_2d8);
      puVar7 = tmp_1;
      puVar8 = local_278;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_double(tmp_1,local_7b8);
      puVar7 = tmp_1;
      puVar8 = local_218;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(tmp_1,tmp,local_218);
      puVar7 = tmp_1;
      puVar8 = local_1b8;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      puVar7 = (uint64_t *)
               ((long)Hacl_P256_PrecompTable_precomp_basepoint_table_w5 +
               (ulong)(tmp[0x17]._4_4_ >> 0x1f & 0x60));
      puVar8 = local_dd8;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      puVar7 = x;
      if ((long)tmp[0x1b] < 0) {
        puVar7 = local_cf8;
      }
      puVar8 = local_f8;
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      point_add(local_dd8,local_dd8,local_f8);
      for (i = 0xfa; i != 0xfffffffb; i = i - 5) {
        point_double(local_dd8,local_dd8);
        point_double(local_dd8,local_dd8);
        point_double(local_dd8,local_dd8);
        point_double(local_dd8,local_dd8);
        point_double(local_dd8,local_dd8);
        uVar3 = Hacl_Bignum_Lib_bn_get_bits_u64(4,tmp + 0x18,i,5);
        puVar7 = x + uVar3 * 0xc;
        puVar8 = local_158;
        for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar8 = *puVar7;
          puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
          puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
        }
        point_add(local_dd8,local_dd8,local_158);
        uVar3 = Hacl_Bignum_Lib_bn_get_bits_u64(4,tmp + 0x14,i,5);
        puVar7 = Hacl_P256_PrecompTable_precomp_basepoint_table_w5 + uVar3 * 0xc;
        puVar8 = local_158;
        for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar8 = *puVar7;
          puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
          puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
        }
        point_add(local_dd8,local_dd8,local_158);
      }
      uVar3 = bn_is_zero_mask4(local_d98);
      if (uVar3 != 0xffffffffffffffff) {
        x[2] = 0;
        x[3] = 0;
        x[0] = 0;
        x[1] = 0;
        to_aff_point_x(x,local_dd8);
        qmod_short(x,x);
        uVar3 = bn_is_eq_mask4(x,tmp + 0xc);
        return uVar3 == 0xffffffffffffffff;
      }
    }
  }
  return false;
}

Assistant:

static inline bool
ecdsa_verify_msg_as_qelem(
  uint64_t *m_q,
  uint8_t *public_key,
  uint8_t *signature_r,
  uint8_t *signature_s
)
{
  uint64_t tmp[28U] = { 0U };
  uint64_t *pk = tmp;
  uint64_t *r_q = tmp + 12U;
  uint64_t *s_q = tmp + 16U;
  uint64_t *u1 = tmp + 20U;
  uint64_t *u2 = tmp + 24U;
  bool is_pk_valid = load_point_vartime(pk, public_key);
  bn_from_bytes_be4(r_q, signature_r);
  bn_from_bytes_be4(s_q, signature_s);
  uint64_t is_r_valid = bn_is_lt_order_and_gt_zero_mask4(r_q);
  uint64_t is_s_valid = bn_is_lt_order_and_gt_zero_mask4(s_q);
  bool is_rs_valid = is_r_valid == 0xFFFFFFFFFFFFFFFFULL && is_s_valid == 0xFFFFFFFFFFFFFFFFULL;
  if (!(is_pk_valid && is_rs_valid))
  {
    return false;
  }
  uint64_t sinv[4U] = { 0U };
  qinv(sinv, s_q);
  qmul_mont(sinv, m_q, u1);
  qmul_mont(sinv, r_q, u2);
  uint64_t res[12U] = { 0U };
  point_mul_double_g(res, u1, u2, pk);
  if (is_point_at_inf_vartime(res))
  {
    return false;
  }
  uint64_t x[4U] = { 0U };
  to_aff_point_x(x, res);
  qmod_short(x, x);
  bool res1 = bn_is_eq_vartime4(x, r_q);
  return res1;
}